

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O2

int read_file(char *path,uint8_t *buffer,int bytes)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = 0;
  iVar6 = 100;
  do {
    uVar4 = bytes - iVar5;
    iVar1 = open(path,0);
    if (-1 < iVar1) {
      uVar2 = fcntl(iVar1,3,0);
      fcntl(iVar1,4,(ulong)(uVar2 | 0x800));
      sVar3 = read(iVar1,buffer,(long)(int)uVar4);
      uVar4 = (uint)sVar3;
      close(iVar1);
    }
    if ((int)uVar4 < 1) {
      iVar1 = iVar6 + -1;
    }
    else {
      buffer = buffer + uVar4;
      iVar5 = iVar5 + uVar4;
      iVar1 = iVar6;
    }
  } while (((int)uVar4 >= 1 || 0 < iVar6) && (iVar6 = iVar1, iVar5 < bytes));
  return iVar5;
}

Assistant:

static int read_file(const char *path, uint8_t *buffer, int bytes) {
    int completed = 0, retries = 100;

    do {
        int len = bytes - completed;

        // Attempt to open the file
        int fd = open(path, O_RDONLY);
        if (fd >= 0) {
            // Set non-blocking mode
            int flags = fcntl(fd, F_GETFL, 0);
            fcntl(fd, F_SETFL, flags | O_NONBLOCK);

            // Launch read request and close file
            len = read(fd, buffer, len);
            close(fd);
        }

        // If read request failed (ie. blocking):
        if (len <= 0) {
            if (--retries >= 0) {
                continue;
            } else {
                // Give up
                break;
            }
        }

        // Subtract off the read byte count from request size
        completed += len;
        buffer += len;
    } while (completed < bytes);

    // Return number of bytes completed
    return completed;
}